

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

Token * __thiscall Tokenizer::getNextToken(Token *__return_storage_ptr__,Tokenizer *this)

{
  __node_base_ptr *__t;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>
  *this_00;
  __node_base_ptr *this_01;
  allocator<std::pair<const_char,_TokenType>_> *this_02;
  initializer_list<std::pair<const_char,_TokenType>_> __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>
  __l_00;
  initializer_list<std::pair<const_char,_TokenType>_> __l_01;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  pointer ppVar4;
  pointer ppVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  *local_820;
  Token local_7a0;
  Token local_770;
  Token local_740;
  Token local_710;
  Token local_6e0;
  Token local_6b0;
  _Node_iterator_base<std::pair<const_char,_TokenType>,_false> local_680;
  _Node_iterator_base<std::pair<const_char,_TokenType>,_false> local_678;
  iterator it_2;
  pair<const_char,_TokenType> local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  iterator local_5f8;
  size_type local_5f0;
  undefined1 local_5e8 [8];
  unordered_map<char,_TokenType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenType>_>_>
  singleChars_1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
  local_580;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
  local_578;
  iterator it_1;
  TokenType local_568 [12];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  *local_538;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_530;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_508;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_4e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_4b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_490;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_468;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_440;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_418;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_3c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_3a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_378;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_350;
  iterator local_328;
  size_type local_320;
  undefined1 local_318 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
  doubleChars;
  variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_2c0;
  Token local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [8];
  string nextTwo;
  Token local_1d0;
  _Node_iterator_base<std::pair<const_char,_TokenType>,_false> local_1a0;
  _Node_iterator_base<std::pair<const_char,_TokenType>,_false> local_198;
  iterator it;
  allocator<std::pair<const_char,_TokenType>_> local_17b;
  key_equal local_17a;
  hasher local_179;
  pair<const_char,_TokenType> local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  iterator local_130;
  size_type local_128;
  undefined1 local_120 [8];
  unordered_map<char,_TokenType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenType>_>_>
  singleChars;
  Token local_b8;
  _Optional_payload_base<char> local_82;
  Token local_80;
  _Optional_payload_base<char> local_4d;
  _Optional_payload_base<char> local_4b;
  char local_49;
  undefined1 local_48 [5];
  optional<char> _;
  char c;
  Tokenizer *this_local;
  
  if ((this->parsingHeaderBlock & 1U) == 0) {
    std::optional<char>::optional((optional<char> *)&local_4b);
    local_4d = (_Optional_payload_base<char>)next(this);
    local_4b = local_4d;
    bVar1 = std::optional<char>::has_value((optional<char> *)&local_4b);
    if (bVar1) {
      pcVar3 = std::optional<char>::value((optional<char> *)&local_4b);
      local_49 = *pcVar3;
      while (iVar2 = isspace((int)local_49), iVar2 != 0) {
        local_82 = (_Optional_payload_base<char>)next(this);
        local_4b = local_82;
        bVar1 = std::optional<char>::has_value((optional<char> *)&local_4b);
        if (!bVar1) {
          Token::Token(&local_b8,Eof);
          Token::operator=(&this->currentToken,&local_b8);
          Token::~Token(&local_b8);
          Token::Token(__return_storage_ptr__,&this->currentToken);
          return __return_storage_ptr__;
        }
        pcVar3 = std::optional<char>::value((optional<char> *)&local_4b);
        local_49 = *pcVar3;
      }
      if (local_49 == '\0') {
        Token::Token((Token *)&singleChars._M_h._M_single_bucket,Eof);
        Token::operator=(&this->currentToken,(Token *)&singleChars._M_h._M_single_bucket);
        Token::~Token((Token *)&singleChars._M_h._M_single_bucket);
        Token::Token(__return_storage_ptr__,&this->currentToken);
      }
      else {
        local_148 = 0x80000002c;
        uStack_140 = 0x90000002e;
        local_158 = 0x60000003b;
        uStack_150 = 0x70000003a;
        local_168 = 0x40000007b;
        uStack_160 = 0x50000007d;
        local_178.first = '(';
        local_178._1_3_ = 0;
        local_178.second = LeftParen;
        uStack_170 = 0x100000029;
        local_130 = &local_178;
        local_128 = 8;
        std::allocator<std::pair<const_char,_TokenType>_>::allocator(&local_17b);
        __l_01._M_len = local_128;
        __l_01._M_array = local_130;
        std::
        unordered_map<char,_TokenType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenType>_>_>
        ::unordered_map((unordered_map<char,_TokenType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenType>_>_>
                         *)local_120,__l_01,0,&local_179,&local_17a,&local_17b);
        std::allocator<std::pair<const_char,_TokenType>_>::~allocator(&local_17b);
        local_198._M_cur =
             (__node_type *)
             std::
             unordered_map<char,_TokenType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenType>_>_>
             ::find((unordered_map<char,_TokenType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenType>_>_>
                     *)local_120,&local_49);
        local_1a0._M_cur =
             (__node_type *)
             std::
             unordered_map<char,_TokenType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenType>_>_>
             ::end((unordered_map<char,_TokenType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenType>_>_>
                    *)local_120);
        bVar1 = std::__detail::operator!=(&local_198,&local_1a0);
        if (bVar1) {
          ppVar5 = std::__detail::_Node_iterator<std::pair<const_char,_TokenType>,_false,_false>::
                   operator->((_Node_iterator<std::pair<const_char,_TokenType>,_false,_false> *)
                              &local_198);
          Token::Token(&local_1d0,ppVar5->second);
          Token::operator=(&this->currentToken,&local_1d0);
          Token::~Token(&local_1d0);
          Token::Token(__return_storage_ptr__,&this->currentToken);
        }
        std::
        unordered_map<char,_TokenType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenType>_>_>
        ::~unordered_map((unordered_map<char,_TokenType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenType>_>_>
                          *)local_120);
        if (!bVar1) {
          local_4b = (_Optional_payload_base<char>)peek(this);
          bVar1 = std::optional<char>::has_value((optional<char> *)&local_4b);
          if (bVar1) {
            std::__cxx11::string::string((string *)&local_268);
            std::operator+(&local_248,&local_268,local_49);
            pcVar3 = std::optional<char>::value((optional<char> *)&local_4b);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_228,&local_248,*pcVar3);
            std::__cxx11::string::~string((string *)&local_248);
            std::__cxx11::string::~string((string *)&local_268);
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_228,"[[");
            if (bVar1) {
              next(this,1);
              this->parsingHeaderBlock = true;
              std::__cxx11::string::operator=((string *)&this->header_block_name,"");
              __t = &doubleChars._M_h._M_single_bucket;
              std::__cxx11::string::string((string *)__t);
              std::variant<int,double,std::__cxx11::string,bool,char>::
              variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
                        ((variant<int,double,std::__cxx11::string,bool,char> *)&local_2c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__t);
              Token::Token(&local_298,HeaderOpener,(tokenValue *)&local_2c0);
              Token::operator=(&this->currentToken,&local_298);
              Token::~Token(&local_298);
              std::
              variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
              ::~variant(&local_2c0);
              std::__cxx11::string::~string((string *)&doubleChars._M_h._M_single_bucket);
              Token::Token(__return_storage_ptr__,&this->currentToken);
            }
            else {
              local_538 = &local_530;
              local_568[0xb] = 0x11;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>
                        (local_538,(char (*) [3])"++",local_568 + 0xb);
              local_538 = &local_508;
              local_568[10] = 0x12;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>
                        (local_538,(char (*) [3])"--",local_568 + 10);
              local_538 = &local_4e0;
              local_568[9] = 0x13;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(local_538,(char (*) [3])"+=",local_568 + 9)
              ;
              local_538 = &local_4b8;
              local_568[8] = 0x14;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(local_538,(char (*) [3])"-=",local_568 + 8)
              ;
              local_538 = &local_490;
              local_568[7] = 0x15;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(local_538,(char (*) [3])"*=",local_568 + 7)
              ;
              local_538 = &local_468;
              local_568[6] = 0x16;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(local_538,(char (*) [3])"/=",local_568 + 6)
              ;
              local_538 = &local_440;
              local_568[5] = 0x17;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(local_538,(char (*) [3])"%=",local_568 + 5)
              ;
              local_538 = &local_418;
              local_568[4] = 0x1a;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(local_538,(char (*) [3])"<=",local_568 + 4)
              ;
              local_538 = &local_3f0;
              local_568[3] = 0x1b;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(local_538,(char (*) [3])">=",local_568 + 3)
              ;
              local_538 = &local_3c8;
              local_568[2] = 0x1c;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(local_538,(char (*) [3])"==",local_568 + 2)
              ;
              local_538 = &local_3a0;
              local_568[1] = 0x1e;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(local_538,(char (*) [3])"&&",local_568 + 1)
              ;
              local_538 = &local_378;
              local_568[0] = Or;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>(local_538,(char (*) [3])"||",local_568);
              local_538 = &local_350;
              it_1.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
              ._M_cur._4_4_ = 0x1d;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
              ::pair<const_char_(&)[3],_TokenType,_true>
                        (local_538,(char (*) [3])"!=",
                         (TokenType *)
                         ((long)&it_1.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
                                 ._M_cur + 4));
              local_328 = &local_530;
              local_320 = 0xd;
              this_00 = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>
                         *)((long)&it_1.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
                                   ._M_cur + 1);
              std::
              allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>
              ::allocator(this_00);
              __l_00._M_len = local_320;
              __l_00._M_array = local_328;
              std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
              ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
                               *)local_318,__l_00,0,
                              (hasher *)
                              ((long)&it_1.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
                                      ._M_cur + 3),
                              (key_equal *)
                              ((long)&it_1.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
                                      ._M_cur + 2),this_00);
              std::
              allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>
              ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>
                            *)((long)&it_1.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
                                      ._M_cur + 1));
              local_820 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
                           *)&local_328;
              do {
                local_820 = local_820 + -1;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
                ::~pair(local_820);
              } while (local_820 != &local_530);
              local_578._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
                   ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
                           *)local_318,(key_type *)local_228);
              local_580._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
                   ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
                          *)local_318);
              bVar1 = std::__detail::operator!=(&local_578,&local_580);
              if (bVar1) {
                next(this,1);
                ppVar4 = std::__detail::
                         _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_false,_true>
                         ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_false,_true>
                                       *)&local_578);
                Token::Token((Token *)&singleChars_1._M_h._M_single_bucket,ppVar4->second);
                this_01 = &singleChars_1._M_h._M_single_bucket;
                Token::operator=(&this->currentToken,(Token *)this_01);
                Token::~Token((Token *)this_01);
                Token::Token(__return_storage_ptr__,&this->currentToken);
              }
              std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
              ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
                                *)local_318);
              if (!bVar1) {
                local_608 = 0x20000005b;
                uStack_600 = 0x30000005d;
                local_618 = 0x230000005e;
                uStack_610 = 0x2200000021;
                local_628 = 0x2000000026;
                uStack_620 = 0x210000007c;
                local_638 = 0x180000003c;
                uStack_630 = 0x190000003e;
                local_648 = 0xf00000025;
                uStack_640 = 0x100000003d;
                local_658 = 0xd0000002a;
                uStack_650 = 0xe0000002f;
                local_668.first = '+';
                local_668._1_3_ = 0;
                local_668.second = Plus;
                uStack_660 = 0xc0000002d;
                local_5f8 = &local_668;
                local_5f0 = 0xe;
                this_02 = (allocator<std::pair<const_char,_TokenType>_> *)
                          ((long)&it_2.
                                  super__Node_iterator_base<std::pair<const_char,_TokenType>,_false>
                                  ._M_cur + 5);
                std::allocator<std::pair<const_char,_TokenType>_>::allocator(this_02);
                __l._M_len = local_5f0;
                __l._M_array = local_5f8;
                std::
                unordered_map<char,_TokenType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenType>_>_>
                ::unordered_map((unordered_map<char,_TokenType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenType>_>_>
                                 *)local_5e8,__l,0,
                                (hasher *)
                                ((long)&it_2.
                                        super__Node_iterator_base<std::pair<const_char,_TokenType>,_false>
                                        ._M_cur + 7),
                                (key_equal *)
                                ((long)&it_2.
                                        super__Node_iterator_base<std::pair<const_char,_TokenType>,_false>
                                        ._M_cur + 6),this_02);
                std::allocator<std::pair<const_char,_TokenType>_>::~allocator
                          ((allocator<std::pair<const_char,_TokenType>_> *)
                           ((long)&it_2.
                                   super__Node_iterator_base<std::pair<const_char,_TokenType>,_false>
                                   ._M_cur + 5));
                local_678._M_cur =
                     (__node_type *)
                     std::
                     unordered_map<char,_TokenType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenType>_>_>
                     ::find((unordered_map<char,_TokenType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenType>_>_>
                             *)local_5e8,&local_49);
                local_680._M_cur =
                     (__node_type *)
                     std::
                     unordered_map<char,_TokenType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenType>_>_>
                     ::end((unordered_map<char,_TokenType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenType>_>_>
                            *)local_5e8);
                bVar1 = std::__detail::operator!=(&local_678,&local_680);
                if (bVar1) {
                  ppVar5 = std::__detail::
                           _Node_iterator<std::pair<const_char,_TokenType>,_false,_false>::
                           operator->((_Node_iterator<std::pair<const_char,_TokenType>,_false,_false>
                                       *)&local_678);
                  Token::Token(&local_6b0,ppVar5->second);
                  Token::operator=(&this->currentToken,&local_6b0);
                  Token::~Token(&local_6b0);
                  Token::Token(__return_storage_ptr__,&this->currentToken);
                }
                std::
                unordered_map<char,_TokenType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenType>_>_>
                ::~unordered_map((unordered_map<char,_TokenType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenType>_>_>
                                  *)local_5e8);
                if (!bVar1) {
                  iVar2 = isdigit((int)local_49);
                  if (iVar2 == 0) {
                    if (local_49 == '\"') {
                      parseString(&local_710,this,'\"');
                      Token::operator=(&this->currentToken,&local_710);
                      Token::~Token(&local_710);
                      Token::Token(__return_storage_ptr__,&this->currentToken);
                    }
                    else if (local_49 == '`') {
                      parseURL(&local_740,this);
                      Token::operator=(&this->currentToken,&local_740);
                      Token::~Token(&local_740);
                      Token::Token(__return_storage_ptr__,&this->currentToken);
                    }
                    else if (local_49 == '\'') {
                      parseChar(&local_770,this);
                      Token::operator=(&this->currentToken,&local_770);
                      Token::~Token(&local_770);
                      Token::Token(__return_storage_ptr__,&this->currentToken);
                    }
                    else {
                      parseName(&local_7a0,this,local_49);
                      Token::operator=(&this->currentToken,&local_7a0);
                      Token::~Token(&local_7a0);
                      Token::Token(__return_storage_ptr__,&this->currentToken);
                    }
                  }
                  else {
                    parseNumber(&local_6e0,this,local_49);
                    Token::operator=(&this->currentToken,&local_6e0);
                    Token::~Token(&local_6e0);
                    Token::Token(__return_storage_ptr__,&this->currentToken);
                  }
                }
              }
            }
            std::__cxx11::string::~string((string *)local_228);
          }
          else {
            Token::Token((Token *)((long)&nextTwo.field_2 + 8),Eof);
            Token::operator=(&this->currentToken,(Token *)((long)&nextTwo.field_2 + 8));
            Token::~Token((Token *)((long)&nextTwo.field_2 + 8));
            Token::Token(__return_storage_ptr__,&this->currentToken);
          }
        }
      }
    }
    else {
      Token::Token(&local_80,Eof);
      Token::operator=(&this->currentToken,&local_80);
      Token::~Token(&local_80);
      Token::Token(__return_storage_ptr__,&this->currentToken);
    }
  }
  else {
    getNextHeaderToken((Token *)local_48,this);
    Token::operator=(&this->currentToken,(Token *)local_48);
    Token::~Token((Token *)local_48);
    Token::Token(__return_storage_ptr__,&this->currentToken);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::getNextToken() {

    if (parsingHeaderBlock) {
        currentToken = getNextHeaderToken();
        return currentToken;
    }
    char c;
    optional<char> _;
    // Get next char of program
    _ = next();
    if (!_.has_value()) {
        currentToken = Token(Eof);
        return currentToken;
    }
    c = _.value();
    // Ignore whitespace
    while (isspace(c)) {
        _ = next();
        if (!_.has_value()) {
            currentToken = Token(Eof);
            return currentToken;
        }
        c = _.value();
    }
    if (!c) {
        currentToken = Token(Eof);
        return currentToken;
    }

    {
        // Find single chars that can't be confused
        unordered_map<char, TokenType> singleChars = {
                {'(', LeftParen},
                {')', RightParen},
                {'{', LeftBrace},
                {'}', RightBrace},
                {';', Semicolon},
                {':', Colon},
                {',', Comma},
                {'.', Dot},
        };
        auto it = singleChars.find(c);

        if (it != singleChars.end()) {
            currentToken = Token(it->second);
            return currentToken;
        }
    }


    _ = peek();
    if (!_.has_value()) {
        currentToken = Token(Eof);
        return currentToken;
    }
    // Find 2-char tokens that could be confused
    string nextTwo = string() + c + _.value();
    if (nextTwo == "[[") {
        next(1);
        parsingHeaderBlock = true;
        header_block_name = "";
        currentToken = Token(HeaderOpener, string());
        return currentToken;
    }
    {
        unordered_map<string, TokenType> doubleChars = {
                {"++", Increment},
                {"--", Decrement},
                {"+=", PlusEquals},
                {"-=", MinusEquals},
                {"*=", MultiplyEquals},
                {"/=", DivideEquals},
                {"%=", ModuloEquals},
                {"<=", LessThanEquals},
                {">=", GreaterThanEquals},
                {"==", DoubleEquals},
                {"&&", And},
                {"||", Or},
                {"!=", NotEquals}
        };
        auto it = doubleChars.find(nextTwo);
        if (it != doubleChars.end()) {
            next(1); // Go one more forward
            currentToken = Token(it->second);
            return currentToken;
        }
    }
    // Find confusable single chars
    {
        unordered_map<char, TokenType> singleChars = {
                {'+', Plus},
                {'-', Minus},
                {'*', Multiply},
                {'/', Divide},
                {'%', Modulo},
                {'=', SingleEquals},
                {'<', LessThan},
                {'>', GreaterThan},
                {'&', BinaryAnd},
                {'|', BinaryOr},
                {'^', BinaryXor},
                {'!', Not},
                {'[', LeftBracket},
                {']', RightBracket},
        };
        auto it = singleChars.find(c);

        if (it != singleChars.end()) {
            currentToken = Token(it->second);
            return currentToken;
        }
    }
    // Integers
    if (isdigit(c)) {
        currentToken = parseNumber(c);
        return currentToken;
    }
    // Strings
    if (c == '"') {
        currentToken = parseString('"');
        return currentToken;
    }
    // URLs
    if (c == '`') {
        currentToken = parseURL();
        return currentToken;
    }
    // Chars
    if (c == '\'') {
        currentToken = parseChar();
        return currentToken;
    }

    currentToken = parseName(c);
    return currentToken;
}